

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::MergeFrom
          (TensorValue_RepeatedLongInts *this,TensorValue_RepeatedLongInts *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0x1afd);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->values_,&from->values_);
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void TensorValue_RepeatedLongInts::MergeFrom(const TensorValue_RepeatedLongInts& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  values_.MergeFrom(from.values_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}